

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * varinfo(lua_State *L,TValue *o)

{
  CallInfo *ci;
  long lVar1;
  Proto *p;
  int lastpc;
  ulong uVar2;
  char *pcVar3;
  int reg;
  char *kind;
  StkId pSVar4;
  char *local_28;
  
  ci = L->ci;
  local_28 = (char *)0x0;
  if ((ci->callstatus & 0x8000) == 0) {
    pSVar4 = (ci->func).p;
    lVar1 = *(long *)pSVar4;
    for (uVar2 = 0; *(byte *)(lVar1 + 10) != uVar2; uVar2 = uVar2 + 1) {
      if (*(TValue **)(*(long *)(lVar1 + 0x20 + uVar2 * 8) + 0x10) == o) {
        pcVar3 = upvalname(*(Proto **)(lVar1 + 0x18),(int)uVar2);
        kind = "upvalue";
        goto LAB_00109c8e;
      }
    }
    reg = 0;
    while (pSVar4 = pSVar4 + 1, pSVar4 < (ci->top).p) {
      if (pSVar4 == (StkId)o) {
        p = *(Proto **)(lVar1 + 0x18);
        lastpc = currentpc(ci);
        kind = getobjname(p,lastpc,reg,&local_28);
        pcVar3 = local_28;
        goto LAB_00109c8e;
      }
      reg = reg + 1;
    }
  }
  pcVar3 = (char *)0x0;
  kind = (char *)0x0;
LAB_00109c8e:
  pcVar3 = formatvarinfo(L,kind,pcVar3);
  return pcVar3;
}

Assistant:

static const char *varinfo (lua_State *L, const TValue *o) {
  CallInfo *ci = L->ci;
  const char *name = NULL;  /* to avoid warnings */
  const char *kind = NULL;
  if (isLua(ci)) {
    kind = getupvalname(ci, o, &name);  /* check whether 'o' is an upvalue */
    if (!kind) {  /* not an upvalue? */
      int reg = instack(ci, o);  /* try a register */
      if (reg >= 0)  /* is 'o' a register? */
        kind = getobjname(ci_func(ci)->p, currentpc(ci), reg, &name);
    }
  }
  return formatvarinfo(L, kind, name);
}